

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O2

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  long *plVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  uint *puVar8;
  ushort *puVar9;
  int *piVar10;
  byte *pbVar11;
  short *psVar12;
  bool bVar13;
  idx_t i_6;
  SelectionVector *pSVar14;
  ValidityMask *pVVar15;
  TemplatedValidityMask<unsigned_long> *this;
  Vector *pVVar16;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference pvVar17;
  type pVVar18;
  ulong uVar19;
  idx_t iVar20;
  InternalException *this_02;
  NotImplementedException *this_03;
  ulong uVar21;
  idx_t iVar22;
  optional_ptr<duckdb::SelectionVector,_true> oVar23;
  ulong *puVar24;
  idx_t i_11;
  idx_t iVar25;
  interval_t *piVar26;
  double *pdVar27;
  float *pfVar28;
  string_t *psVar29;
  uhugeint_t *puVar30;
  hugeint_t *phVar31;
  idx_t i;
  sel_t sVar32;
  size_type __n;
  UnifiedVectorFormat *pUVar33;
  ulong uVar34;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar35;
  ulong uVar36;
  idx_t i_8;
  idx_t false_count_2;
  idx_t iVar37;
  ulong uVar38;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  idx_t iVar39;
  ValidityMask *pVVar40;
  long lVar41;
  idx_t i_5;
  ulong uVar42;
  idx_t pos;
  interval_t *piVar43;
  double *pdVar44;
  float *pfVar45;
  string_t *psVar46;
  uhugeint_t *puVar47;
  hugeint_t *phVar48;
  bool bVar49;
  bool bVar50;
  idx_t local_4c0;
  idx_t pos_1;
  UnifiedVectorFormat lvdata;
  idx_t local_420;
  optional_ptr<duckdb::ValidityMask,_true> local_418;
  UnifiedVectorFormat rvdata;
  optional_ptr<duckdb::ValidityMask,_true> local_3a8;
  SelectionVector lcursor;
  SelectionVector rcursor;
  SelectionVector maybe_vec;
  SelectionVector slice_sel;
  SelectionVector true_sel_1;
  ValidityMask child_validity;
  SelectionVector false_sel_1;
  Vector lchild;
  OptionalSelection false_opt;
  OptionalSelection true_opt;
  optional_ptr<duckdb::SelectionVector,_true> local_240;
  optional_ptr<const_duckdb::SelectionVector,_true> local_238;
  UnifiedVectorFormat rvdata_1;
  UnifiedVectorFormat lvdata_1;
  optional_ptr<duckdb::SelectionVector,_true> local_1a0;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector rchild;
  Vector l_not_null;
  Vector r_not_null;
  
  PVar1 = (left->type).physical_type_;
  pos_1 = (idx_t)sel.ptr;
  switch(PVar1) {
  case BOOL:
  case INT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = (char)pdVar7[iVar20] < (char)pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = (char)pdVar7[iVar20] < (char)pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = (char)pdVar7[iVar20] < (char)pdVar6[iVar20];
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
LAB_0196d637:
        return count - lVar41;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = (char)*pdVar7 < (char)pdVar6[iVar20];
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
LAB_0196dfe5:
            local_4c0 = count - lVar41;
          }
          else {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = (char)*pdVar7 < (char)pdVar6[iVar20];
              }
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar50;
            }
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = (char)*pdVar7 < (char)pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = (char)*pdVar6 <= (char)pdVar7[iVar20];
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
LAB_0196e05e:
            local_4c0 = count - lVar41;
          }
          else {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (!bVar49 && bVar50) {
                bVar50 = (char)pdVar7[iVar20] < (char)*pdVar6;
              }
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar50;
            }
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = (char)pdVar7[iVar20] < (char)*pdVar6;
              bVar50 = (char)*pdVar6 <= (char)pdVar7[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
LAB_0196e329:
        pUVar33 = &lvdata;
        goto LAB_0196e32e;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196a28f;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196a2a4;
          }
          else {
LAB_0196a28f:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196a2a4;
              goto LAB_0196a2e5;
            }
          }
        }
        if ((char)*right->data < (char)*left->data) {
LAB_0196a2a4:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196a2e5:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01963ed3;
LAB_01963ef2:
            if ((char)rvdata.data[uVar21] < (char)lvdata.data[uVar42]) goto LAB_01963f0d;
LAB_01963efb:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_01963ed3:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_01963ef2;
              if (uVar38 != 0) goto LAB_01963f0d;
              goto LAB_01963efb;
            }
            if (uVar38 != 0) goto LAB_01963ef2;
LAB_01963f0d:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_0196625a;
LAB_01966278:
            if ((char)rvdata.data[uVar21] < (char)lvdata.data[uVar42]) {
LAB_01966281:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_01966278;
              goto LAB_01966281;
            }
LAB_0196625a:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_01966278;
            if (uVar38 != 0) goto LAB_01966281;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196a23f;
LAB_0196a25d:
          if ((char)lvdata.data[uVar42] <= (char)rvdata.data[uVar21]) {
LAB_0196a266:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196a23f:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196a25d;
            if (uVar38 != 0) goto LAB_0196a275;
            goto LAB_0196a266;
          }
          if (uVar38 != 0) goto LAB_0196a25d;
        }
LAB_0196a275:
      }
LAB_0196c365:
      local_4c0 = count - lVar41;
      goto LAB_0196c70c;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if ((char)rvdata.data[iVar37] < (char)lvdata.data[iVar22]) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if ((char)rvdata.data[iVar22] < (char)lvdata.data[iVar39]) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if ((char)lvdata.data[iVar39] <= (char)rvdata.data[iVar22]) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case UINT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = pdVar7[iVar20] < pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = pdVar7[iVar20] < pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = pdVar7[iVar20] < pdVar6[iVar20];
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_0196d637;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        pbVar11 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = *pbVar11 < pdVar6[iVar20];
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
            goto LAB_0196dfe5;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *pbVar11 < pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *pbVar11 < pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pbVar11 = left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = *pbVar11 <= pdVar6[iVar20];
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
            goto LAB_0196e05e;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (!bVar49 && bVar50) {
              bVar50 = pdVar6[iVar20] < *pbVar11;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = pdVar6[iVar20] < *pbVar11;
              bVar50 = *pbVar11 <= pdVar6[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196c9e5;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196ca06;
          }
          else {
LAB_0196c9e5:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196ca06;
              goto LAB_0196d0f0;
            }
          }
        }
        if (*right->data < *left->data) {
LAB_0196ca06:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196d0f0:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_019660ff;
LAB_0196611d:
            if (rvdata.data[uVar21] < lvdata.data[uVar42]) goto LAB_01966138;
LAB_01966126:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_019660ff:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_0196611d;
              if (uVar38 != 0) goto LAB_01966138;
              goto LAB_01966126;
            }
            if (uVar38 != 0) goto LAB_0196611d;
LAB_01966138:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01967e1c;
LAB_01967e3a:
            if (rvdata.data[uVar21] < lvdata.data[uVar42]) {
LAB_01967e43:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_01967e3a;
              goto LAB_01967e43;
            }
LAB_01967e1c:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_01967e3a;
            if (uVar38 != 0) goto LAB_01967e43;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196bfb8;
LAB_0196bfd6:
          if (lvdata.data[uVar42] <= rvdata.data[uVar21]) {
LAB_0196bfdf:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196bfb8:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196bfd6;
            if (uVar38 != 0) goto LAB_0196bfee;
            goto LAB_0196bfdf;
          }
          if (uVar38 != 0) goto LAB_0196bfd6;
        }
LAB_0196bfee:
      }
      goto LAB_0196c365;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (rvdata.data[iVar37] < lvdata.data[iVar22]) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (rvdata.data[iVar22] < lvdata.data[iVar39]) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (lvdata.data[iVar39] <= rvdata.data[iVar22]) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case UINT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(ushort *)(pdVar7 + iVar20 * 2) < *(ushort *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(ushort *)(pdVar7 + iVar20 * 2) < *(ushort *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = *(ushort *)(pdVar7 + iVar20 * 2) < *(ushort *)(pdVar6 + iVar20 * 2);
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_0196d637;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        puVar9 = (ushort *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = *puVar9 < *(ushort *)(pdVar6 + iVar20 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
            goto LAB_0196dfe5;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *puVar9 < *(ushort *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *puVar9 < *(ushort *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar9 = (ushort *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = *puVar9 <= *(ushort *)(pdVar6 + iVar20 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
            goto LAB_0196e05e;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (!bVar49 && bVar50) {
              bVar50 = *(ushort *)(pdVar6 + iVar20 * 2) < *puVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = *(ushort *)(pdVar6 + iVar20 * 2) < *puVar9;
              bVar50 = *puVar9 <= *(ushort *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196c913;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196c936;
          }
          else {
LAB_0196c913:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196c936;
              goto LAB_0196d054;
            }
          }
        }
        if (*(ushort *)right->data < *(ushort *)left->data) {
LAB_0196c936:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196d054:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01965f3d;
LAB_01965f5b:
            if (*(ushort *)(rvdata.data + uVar21 * 2) < *(ushort *)(lvdata.data + uVar42 * 2))
            goto LAB_01965f78;
LAB_01965f66:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_01965f3d:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_01965f5b;
              if (uVar38 != 0) goto LAB_01965f78;
              goto LAB_01965f66;
            }
            if (uVar38 != 0) goto LAB_01965f5b;
LAB_01965f78:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01967b82;
LAB_01967ba0:
            if (*(ushort *)(rvdata.data + uVar21 * 2) < *(ushort *)(lvdata.data + uVar42 * 2)) {
LAB_01967bab:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_01967ba0;
              goto LAB_01967bab;
            }
LAB_01967b82:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_01967ba0;
            if (uVar38 != 0) goto LAB_01967bab;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196bd8c;
LAB_0196bdaa:
          if (*(ushort *)(lvdata.data + uVar42 * 2) <= *(ushort *)(rvdata.data + uVar21 * 2)) {
LAB_0196bdb5:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196bd8c:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196bdaa;
            if (uVar38 != 0) goto LAB_0196bdc4;
            goto LAB_0196bdb5;
          }
          if (uVar38 != 0) goto LAB_0196bdaa;
        }
LAB_0196bdc4:
      }
      goto LAB_0196c365;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(ushort *)(rvdata.data + iVar37 * 2) < *(ushort *)(lvdata.data + iVar22 * 2)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(ushort *)(rvdata.data + iVar22 * 2) < *(ushort *)(lvdata.data + iVar39 * 2)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(ushort *)(lvdata.data + iVar39 * 2) <= *(ushort *)(rvdata.data + iVar22 * 2)) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case INT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(short *)(pdVar7 + iVar20 * 2) < *(short *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(short *)(pdVar7 + iVar20 * 2) < *(short *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = *(short *)(pdVar7 + iVar20 * 2) < *(short *)(pdVar6 + iVar20 * 2);
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_0196d637;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        psVar12 = (short *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = *psVar12 < *(short *)(pdVar6 + iVar20 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
            goto LAB_0196dfe5;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *psVar12 < *(short *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *psVar12 < *(short *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar12 = (short *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = *psVar12 <= *(short *)(pdVar6 + iVar20 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
            goto LAB_0196e05e;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (!bVar49 && bVar50) {
              bVar50 = *(short *)(pdVar6 + iVar20 * 2) < *psVar12;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = *(short *)(pdVar6 + iVar20 * 2) < *psVar12;
              bVar50 = *psVar12 <= *(short *)(pdVar6 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196cc1e;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196cc41;
          }
          else {
LAB_0196cc1e:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196cc41;
              goto LAB_0196d13e;
            }
          }
        }
        if (*(short *)right->data < *(short *)left->data) {
LAB_0196cc41:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196d13e:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_019664f7;
LAB_01966515:
            if (*(short *)(rvdata.data + uVar21 * 2) < *(short *)(lvdata.data + uVar42 * 2))
            goto LAB_01966532;
LAB_01966520:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_019664f7:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_01966515;
              if (uVar38 != 0) goto LAB_01966532;
              goto LAB_01966520;
            }
            if (uVar38 != 0) goto LAB_01966515;
LAB_01966532:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01968224;
LAB_01968242:
            if (*(short *)(rvdata.data + uVar21 * 2) < *(short *)(lvdata.data + uVar42 * 2)) {
LAB_0196824d:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_01968242;
              goto LAB_0196824d;
            }
LAB_01968224:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_01968242;
            if (uVar38 != 0) goto LAB_0196824d;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196c31e;
LAB_0196c33c:
          if (*(short *)(lvdata.data + uVar42 * 2) <= *(short *)(rvdata.data + uVar21 * 2)) {
LAB_0196c347:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196c31e:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196c33c;
            if (uVar38 != 0) goto LAB_0196c356;
            goto LAB_0196c347;
          }
          if (uVar38 != 0) goto LAB_0196c33c;
        }
LAB_0196c356:
      }
      goto LAB_0196c365;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(short *)(rvdata.data + iVar37 * 2) < *(short *)(lvdata.data + iVar22 * 2)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(short *)(rvdata.data + iVar22 * 2) < *(short *)(lvdata.data + iVar39 * 2)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(short *)(lvdata.data + iVar39 * 2) <= *(short *)(rvdata.data + iVar22 * 2)) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case UINT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(uint *)(pdVar7 + iVar20 * 4) < *(uint *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(uint *)(pdVar7 + iVar20 * 4) < *(uint *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = *(uint *)(pdVar7 + iVar20 * 4) < *(uint *)(pdVar6 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_0196d637;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        puVar8 = (uint *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = *puVar8 < *(uint *)(pdVar6 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
            goto LAB_0196dfe5;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *puVar8 < *(uint *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *puVar8 < *(uint *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar8 = (uint *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = *puVar8 <= *(uint *)(pdVar6 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
            goto LAB_0196e05e;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (!bVar49 && bVar50) {
              bVar50 = *(uint *)(pdVar6 + iVar20 * 4) < *puVar8;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = *(uint *)(pdVar6 + iVar20 * 4) < *puVar8;
              bVar50 = *puVar8 <= *(uint *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196c8ab;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196c8cc;
          }
          else {
LAB_0196c8ab:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196c8cc;
              goto LAB_0196d006;
            }
          }
        }
        if (*(uint *)right->data < *(uint *)left->data) {
LAB_0196c8cc:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196d006:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01965e5d;
LAB_01965e7b:
            if (*(uint *)(rvdata.data + uVar21 * 4) < *(uint *)(lvdata.data + uVar42 * 4))
            goto LAB_01965e96;
LAB_01965e84:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_01965e5d:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_01965e7b;
              if (uVar38 != 0) goto LAB_01965e96;
              goto LAB_01965e84;
            }
            if (uVar38 != 0) goto LAB_01965e7b;
LAB_01965e96:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01967a34;
LAB_01967a52:
            if (*(uint *)(rvdata.data + uVar21 * 4) < *(uint *)(lvdata.data + uVar42 * 4)) {
LAB_01967a5b:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_01967a52;
              goto LAB_01967a5b;
            }
LAB_01967a34:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_01967a52;
            if (uVar38 != 0) goto LAB_01967a5b;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196bc75;
LAB_0196bc93:
          if (*(uint *)(lvdata.data + uVar42 * 4) <= *(uint *)(rvdata.data + uVar21 * 4)) {
LAB_0196bc9c:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196bc75:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196bc93;
            if (uVar38 != 0) goto LAB_0196bcab;
            goto LAB_0196bc9c;
          }
          if (uVar38 != 0) goto LAB_0196bc93;
        }
LAB_0196bcab:
      }
      goto LAB_0196c365;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(uint *)(rvdata.data + iVar37 * 4) < *(uint *)(lvdata.data + iVar22 * 4)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(uint *)(rvdata.data + iVar22 * 4) < *(uint *)(lvdata.data + iVar39 * 4)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(uint *)(lvdata.data + iVar39 * 4) <= *(uint *)(rvdata.data + iVar22 * 4)) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case INT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(int *)(pdVar7 + iVar20 * 4) < *(int *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(int *)(pdVar7 + iVar20 * 4) < *(int *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = *(int *)(pdVar7 + iVar20 * 4) < *(int *)(pdVar6 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_0196d637;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        piVar10 = (int *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = *piVar10 < *(int *)(pdVar6 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
            goto LAB_0196dfe5;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *piVar10 < *(int *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *piVar10 < *(int *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar10 = (int *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = *piVar10 <= *(int *)(pdVar6 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
            goto LAB_0196e05e;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (!bVar49 && bVar50) {
              bVar50 = *(int *)(pdVar6 + iVar20 * 4) < *piVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = *(int *)(pdVar6 + iVar20 * 4) < *piVar10;
              bVar50 = *piVar10 <= *(int *)(pdVar6 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196c97d;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196c99e;
          }
          else {
LAB_0196c97d:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196c99e;
              goto LAB_0196d0a2;
            }
          }
        }
        if (*(int *)right->data < *(int *)left->data) {
LAB_0196c99e:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196d0a2:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_0196601f;
LAB_0196603d:
            if (*(int *)(rvdata.data + uVar21 * 4) < *(int *)(lvdata.data + uVar42 * 4))
            goto LAB_01966058;
LAB_01966046:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_0196601f:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_0196603d;
              if (uVar38 != 0) goto LAB_01966058;
              goto LAB_01966046;
            }
            if (uVar38 != 0) goto LAB_0196603d;
LAB_01966058:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01967cd0;
LAB_01967cee:
            if (*(int *)(rvdata.data + uVar21 * 4) < *(int *)(lvdata.data + uVar42 * 4)) {
LAB_01967cf7:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_01967cee;
              goto LAB_01967cf7;
            }
LAB_01967cd0:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_01967cee;
            if (uVar38 != 0) goto LAB_01967cf7;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196bea3;
LAB_0196bec1:
          if (*(int *)(lvdata.data + uVar42 * 4) <= *(int *)(rvdata.data + uVar21 * 4)) {
LAB_0196beca:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196bea3:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196bec1;
            if (uVar38 != 0) goto LAB_0196bed9;
            goto LAB_0196beca;
          }
          if (uVar38 != 0) goto LAB_0196bec1;
        }
LAB_0196bed9:
      }
      goto LAB_0196c365;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(int *)(rvdata.data + iVar37 * 4) < *(int *)(lvdata.data + iVar22 * 4)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(int *)(rvdata.data + iVar22 * 4) < *(int *)(lvdata.data + iVar39 * 4)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(int *)(lvdata.data + iVar39 * 4) <= *(int *)(rvdata.data + iVar22 * 4)) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case UINT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(ulong *)(pdVar7 + iVar20 * 8) < *(ulong *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(ulong *)(pdVar7 + iVar20 * 8) < *(ulong *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = *(ulong *)(pdVar7 + iVar20 * 8) < *(ulong *)(pdVar6 + iVar20 * 8);
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_0196d637;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        puVar24 = (ulong *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = *puVar24 < *(ulong *)(pdVar6 + iVar20 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
            goto LAB_0196dfe5;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *puVar24 < *(ulong *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *puVar24 < *(ulong *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        puVar24 = (ulong *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = *puVar24 <= *(ulong *)(pdVar6 + iVar20 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
            goto LAB_0196e05e;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (!bVar49 && bVar50) {
              bVar50 = *(ulong *)(pdVar6 + iVar20 * 8) < *puVar24;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = *(ulong *)(pdVar6 + iVar20 * 8) < *puVar24;
              bVar50 = *puVar24 <= *(ulong *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196c841;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196c864;
          }
          else {
LAB_0196c841:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196c864;
              goto LAB_0196cfb8;
            }
          }
        }
        if (*(ulong *)right->data < *(ulong *)left->data) {
LAB_0196c864:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196cfb8:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01965d7c;
LAB_01965d9a:
            if (*(ulong *)(rvdata.data + uVar21 * 8) < *(ulong *)(lvdata.data + uVar42 * 8))
            goto LAB_01965db6;
LAB_01965da4:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_01965d7c:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_01965d9a;
              if (uVar38 != 0) goto LAB_01965db6;
              goto LAB_01965da4;
            }
            if (uVar38 != 0) goto LAB_01965d9a;
LAB_01965db6:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_019678e7;
LAB_01967905:
            if (*(ulong *)(rvdata.data + uVar21 * 8) < *(ulong *)(lvdata.data + uVar42 * 8)) {
LAB_0196790f:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_01967905;
              goto LAB_0196790f;
            }
LAB_019678e7:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_01967905;
            if (uVar38 != 0) goto LAB_0196790f;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196bb5f;
LAB_0196bb7d:
          if (*(ulong *)(lvdata.data + uVar42 * 8) <= *(ulong *)(rvdata.data + uVar21 * 8)) {
LAB_0196bb87:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196bb5f:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196bb7d;
            if (uVar38 != 0) goto LAB_0196bb96;
            goto LAB_0196bb87;
          }
          if (uVar38 != 0) goto LAB_0196bb7d;
        }
LAB_0196bb96:
      }
      goto LAB_0196c365;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(ulong *)(rvdata.data + iVar37 * 8) < *(ulong *)(lvdata.data + iVar22 * 8)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(ulong *)(rvdata.data + iVar22 * 8) < *(ulong *)(lvdata.data + iVar39 * 8)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(ulong *)(lvdata.data + iVar39 * 8) <= *(ulong *)(rvdata.data + iVar22 * 8)) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case INT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar6 = left->data;
        pdVar7 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(long *)(pdVar7 + iVar20 * 8) < *(long *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar50 && bVar49) {
              bVar49 = *(long *)(pdVar7 + iVar20 * 8) < *(long *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar50 && bVar49) {
            bVar49 = *(long *)(pdVar7 + iVar20 * 8) < *(long *)(pdVar6 + iVar20 * 8);
          }
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)(bVar49 ^ 1);
        }
        goto LAB_0196d637;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar6 = left->data;
        plVar5 = (long *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = true;
              }
              else {
                bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
              }
              if ((bVar49 & bVar50) == 1) {
                bVar50 = *plVar5 < *(long *)(pdVar6 + iVar20 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
            }
            goto LAB_0196dfe5;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *plVar5 < *(long *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = true;
            }
            else {
              bVar50 = (bool)(*(byte *)&(lvdata.sel)->sel_vector & 1);
            }
            if ((bVar49 & bVar50) == 1) {
              bVar50 = *plVar5 < *(long *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)(bVar50 ^ 1);
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar5 = (long *)left->data;
        pdVar6 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = !bVar50;
              if (!bVar49 && !bVar50) {
                bVar50 = *plVar5 <= *(long *)(pdVar6 + iVar20 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)bVar50;
            }
            goto LAB_0196e05e;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (!bVar49 && bVar50) {
              bVar50 = *(long *)(pdVar6 + iVar20 * 8) < *plVar5;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar50;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar13 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = !bVar13;
            if (!bVar49 && !bVar50) {
              bVar13 = *(long *)(pdVar6 + iVar20 * 8) < *plVar5;
              bVar50 = *plVar5 <= *(long *)(pdVar6 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar13;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)bVar50;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar24 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar24 == (ulong *)0x0) {
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 != (ulong *)0x0) {
            bVar49 = false;
            goto LAB_0196c7d7;
          }
        }
        else {
          uVar19 = *puVar24;
          bVar49 = (uVar19 & 1) == 0;
          puVar24 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar24 == (ulong *)0x0) {
            if ((uVar19 & 1) == 0) goto LAB_0196c7fa;
          }
          else {
LAB_0196c7d7:
            if ((bVar49) || ((*puVar24 & 1) == 0)) {
              if ((*puVar24 & 1) != 0) goto LAB_0196c7fa;
              goto LAB_0196cf6a;
            }
          }
        }
        if (*(long *)right->data < *(long *)left->data) {
LAB_0196c7fa:
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
LAB_0196cf6a:
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01965c9b;
LAB_01965cb9:
            if (*(long *)(rvdata.data + uVar21 * 8) < *(long *)(lvdata.data + uVar42 * 8))
            goto LAB_01965cd5;
LAB_01965cc3:
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
LAB_01965c9b:
              uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                       rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [uVar21 >> 6];
              if ((bVar49) && (uVar38 != 0)) goto LAB_01965cb9;
              if (uVar38 != 0) goto LAB_01965cd5;
              goto LAB_01965cc3;
            }
            if (uVar38 != 0) goto LAB_01965cb9;
LAB_01965cd5:
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = true;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) goto LAB_01967799;
LAB_019677b7:
            if (*(long *)(rvdata.data + uVar21 * 8) < *(long *)(lvdata.data + uVar42 * 8)) {
LAB_019677c1:
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
              local_4c0 = local_4c0 + 1;
            }
          }
          else {
            uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                     lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar42 >> 6];
            bVar49 = uVar38 != 0;
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              if (uVar38 != 0) goto LAB_019677b7;
              goto LAB_019677c1;
            }
LAB_01967799:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_019677b7;
            if (uVar38 != 0) goto LAB_019677c1;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = true;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) goto LAB_0196ba49;
LAB_0196ba67:
          if (*(long *)(lvdata.data + uVar42 * 8) <= *(long *)(rvdata.data + uVar21 * 8)) {
LAB_0196ba71:
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
            lVar41 = lVar41 + 1;
          }
        }
        else {
          uVar38 = 1L << ((byte)uVar42 & 0x3f) &
                   lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar42 >> 6];
          bVar49 = uVar38 != 0;
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
LAB_0196ba49:
            uVar38 = 1L << ((byte)uVar21 & 0x3f) &
                     rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar21 >> 6];
            if ((bVar49) && (uVar38 != 0)) goto LAB_0196ba67;
            if (uVar38 != 0) goto LAB_0196ba80;
            goto LAB_0196ba71;
          }
          if (uVar38 != 0) goto LAB_0196ba67;
        }
LAB_0196ba80:
      }
      goto LAB_0196c365;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        if (*(long *)(rvdata.data + iVar37 * 8) < *(long *)(lvdata.data + iVar22 * 8)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar39;
        iVar20 = iVar22;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(long *)(rvdata.data + iVar22 * 8) < *(long *)(lvdata.data + iVar39 * 8)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(long *)(lvdata.data + iVar39 * 8) <= *(long *)(rvdata.data + iVar22 * 8)) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_0196293a_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&lvdata,"Invalid type for distinct selection",(allocator *)&rvdata);
    InternalException::InternalException(this_02,(string *)&lvdata);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar45 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            pfVar45 = pfVar45 + 1;
            pfVar28 = pfVar28 + 1;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pfVar45 = pfVar45 + 1;
            pfVar28 = pfVar28 + 1;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar49,!bVar50);
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)!bVar49;
          pfVar45 = pfVar45 + 1;
          pfVar28 = pfVar28 + 1;
        }
LAB_0196d7a5:
        return count - lVar41;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar45 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar49,bVar50);
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              pfVar28 = pfVar28 + 1;
            }
            goto LAB_0196e31c;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar49,bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pfVar28 = pfVar28 + 1;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,!bVar49,bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            pfVar28 = pfVar28 + 1;
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar45 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,bVar49,!bVar50);
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              pfVar45 = pfVar45 + 1;
            }
LAB_0196e31c:
            local_4c0 = count - lVar41;
          }
          else {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              pfVar45 = pfVar45 + 1;
            }
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<float>(pfVar28,pfVar45,bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            pfVar45 = pfVar45 + 1;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<float>
                           ((float *)left->data,(float *)right->data,bVar49,bVar50);
        if (!bVar49) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar42 >> 6] >> (uVar42 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<float>
                             ((float *)(lvdata.data + uVar42 * 4),
                              (float *)(rvdata.data + uVar21 * 4),bVar49,bVar50);
          if (bVar49) {
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar42 >> 6] >> (uVar42 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<float>
                             ((float *)(lvdata.data + uVar42 * 4),
                              (float *)(rvdata.data + uVar21 * 4),bVar49,bVar50);
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar42 >> 6] >> (uVar42 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<float>
                           ((float *)(lvdata.data + uVar42 * 4),(float *)(rvdata.data + uVar21 * 4),
                            bVar49,bVar50);
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
          lVar41 = lVar41 + 1;
        }
      }
LAB_0196c6ff:
      local_4c0 = count - lVar41;
      goto LAB_0196c70c;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        bVar49 = GreaterThan::Operation<float>
                           ((float *)(lvdata.data + uVar42 * 4),(float *)(rvdata.data + uVar21 * 4))
        ;
        if (bVar49) {
          iVar25 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          iVar39 = iVar20;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar39 = iVar20 + 1;
          iVar25 = iVar20;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
        iVar20 = iVar39;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        bVar49 = GreaterThan::Operation<float>
                           ((float *)(lvdata.data + uVar42 * 4),(float *)(rvdata.data + uVar21 * 4))
        ;
        if (bVar49) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
      uVar34 = uVar19;
      if (*(long *)pos_1 != 0) {
        uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
      }
      uVar42 = uVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
      }
      uVar21 = uVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
      }
      bVar49 = GreaterThan::Operation<float>
                         ((float *)(lvdata.data + uVar42 * 4),(float *)(rvdata.data + uVar21 * 4));
      if (!bVar49) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
        lVar41 = lVar41 + 1;
      }
    }
    goto LAB_0196c635;
  case DOUBLE:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar44 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            pdVar44 = pdVar44 + 1;
            pdVar27 = pdVar27 + 1;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pdVar44 = pdVar44 + 1;
            pdVar27 = pdVar27 + 1;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar49,!bVar50);
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)!bVar49;
          pdVar44 = pdVar44 + 1;
          pdVar27 = pdVar27 + 1;
        }
        goto LAB_0196d7a5;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar44 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar49,bVar50);
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              pdVar27 = pdVar27 + 1;
            }
            goto LAB_0196e31c;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar49,bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pdVar27 = pdVar27 + 1;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,!bVar49,bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            pdVar27 = pdVar27 + 1;
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar44 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,bVar49,!bVar50);
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              pdVar44 = pdVar44 + 1;
            }
            goto LAB_0196e31c;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            pdVar44 = pdVar44 + 1;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<double>(pdVar27,pdVar44,bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            pdVar44 = pdVar44 + 1;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<double>
                           ((double *)left->data,(double *)right->data,bVar49,bVar50);
        if (!bVar49) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar42 >> 6] >> (uVar42 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<double>
                             ((double *)(lvdata.data + uVar42 * 8),
                              (double *)(rvdata.data + uVar21 * 8),bVar49,bVar50);
          if (bVar49) {
            iVar25 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar39 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar39 = iVar20 + 1;
            iVar25 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
          iVar20 = iVar39;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar34 = uVar19;
          if (*(long *)pos_1 != 0) {
            uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
          }
          uVar42 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar42 >> 6] >> (uVar42 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<double>
                             ((double *)(lvdata.data + uVar42 * 8),
                              (double *)(rvdata.data + uVar21 * 8),bVar49,bVar50);
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar42 >> 6] >> (uVar42 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<double>
                           ((double *)(lvdata.data + uVar42 * 8),
                            (double *)(rvdata.data + uVar21 * 8),bVar49,bVar50);
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
          lVar41 = lVar41 + 1;
        }
      }
      goto LAB_0196c6ff;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        bVar49 = GreaterThan::Operation<double>
                           ((double *)(lvdata.data + uVar42 * 8),
                            (double *)(rvdata.data + uVar21 * 8));
        if (bVar49) {
          iVar25 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          iVar39 = iVar20;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar39 = iVar20 + 1;
          iVar25 = iVar20;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar25] = (sel_t)uVar34;
        iVar20 = iVar39;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar34 = uVar19;
        if (*(long *)pos_1 != 0) {
          uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
        }
        uVar42 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        bVar49 = GreaterThan::Operation<double>
                           ((double *)(lvdata.data + uVar42 * 8),
                            (double *)(rvdata.data + uVar21 * 8));
        if (bVar49) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar34;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
      uVar34 = uVar19;
      if (*(long *)pos_1 != 0) {
        uVar34 = (ulong)*(uint *)(*(long *)pos_1 + uVar19 * 4);
      }
      uVar42 = uVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar42 = (ulong)(lvdata.sel)->sel_vector[uVar19];
      }
      uVar21 = uVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
      }
      bVar49 = GreaterThan::Operation<double>
                         ((double *)(lvdata.data + uVar42 * 8),(double *)(rvdata.data + uVar21 * 8))
      ;
      if (!bVar49) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)uVar34;
        lVar41 = lVar41 + 1;
      }
    }
    goto LAB_0196c635;
  case INTERVAL:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
      pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar43 = (interval_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar40 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            piVar43 = piVar43 + 1;
            piVar26 = piVar26 + 1;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            piVar43 = piVar43 + 1;
            piVar26 = piVar26 + 1;
          }
          return local_4c0;
        }
        lVar41 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                             (piVar26,piVar43,!bVar49,!bVar50);
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + (ulong)!bVar49;
          piVar43 = piVar43 + 1;
          piVar26 = piVar26 + 1;
        }
        goto LAB_0196d7a5;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar43 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar15 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                                 (piVar26,piVar43,!bVar49,bVar50);
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              piVar26 = piVar26 + 1;
            }
            goto LAB_0196e31c;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar49,bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            piVar26 = piVar26 + 1;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,!bVar49,bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            piVar26 = piVar26 + 1;
          }
        }
        goto LAB_0196e329;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar43 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar15 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar41 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                                 (piVar26,piVar43,bVar49,!bVar50);
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              piVar43 = piVar43 + 1;
            }
            goto LAB_0196e31c;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            piVar43 = piVar43 + 1;
          }
        }
        else {
          lVar41 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                               (piVar26,piVar43,bVar49,!bVar50);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + bVar49;
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            piVar43 = piVar43 + 1;
          }
        }
        goto LAB_0196e329;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (*puVar3 & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                           ((interval_t *)left->data,(interval_t *)right->data,bVar49,bVar50);
        if (!bVar49) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if (*(long *)pos_1 != 0) {
            iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
          }
          iVar22 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar37 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar22 * 0x10),
                              (interval_t *)(rvdata.data + iVar37 * 0x10),bVar49,bVar50);
          if (bVar49) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
          iVar20 = iVar37;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          iVar39 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar39 * 0x10),
                              (interval_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = false;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
        }
        bVar49 = DistinctGreaterThan::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar39 * 0x10),
                            (interval_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + 1;
        }
      }
      goto LAB_0196c6ff;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
        iVar39 = iVar25;
        if (*(long *)pos_1 != 0) {
          iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
        }
        iVar22 = iVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
        }
        iVar37 = iVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
        }
        bVar49 = interval_t::operator>
                           ((interval_t *)(lvdata.data + iVar22 * 0x10),
                            (interval_t *)(rvdata.data + iVar37 * 0x10));
        if (bVar49) {
          iVar22 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          iVar37 = iVar20;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar37 = iVar20 + 1;
          iVar22 = iVar20;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
        iVar20 = iVar37;
      }
      goto LAB_0196c70c;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar49 = interval_t::operator>
                           ((interval_t *)(lvdata.data + iVar39 * 0x10),
                            (interval_t *)(rvdata.data + iVar22 * 0x10));
        if (bVar49) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0196c70c;
    }
    lVar41 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar25 = iVar20;
      if (*(long *)pos_1 != 0) {
        iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
      }
      iVar39 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      bVar49 = interval_t::operator>
                         ((interval_t *)(lvdata.data + iVar39 * 0x10),
                          (interval_t *)(rvdata.data + iVar22 * 0x10));
      if (!bVar49) {
        (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
        lVar41 = lVar41 + 1;
      }
    }
    goto LAB_0196c635;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_240.ptr = false_sel.ptr;
    local_238.ptr = sel.ptr;
    local_1a0.ptr = true_sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_238.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&true_vec,count);
    OptionalSelection::OptionalSelection(&true_opt,&true_vec);
    SelectionVector::SelectionVector(&false_vec,count);
    OptionalSelection::OptionalSelection(&false_opt,&false_vec);
    SelectionVector::SelectionVector(&maybe_vec,count);
    Vector::Vector(&l_not_null,left);
    Vector::Vector(&r_not_null,right);
    pSVar14 = optional_ptr<const_duckdb::SelectionVector,_true>::operator*(&local_238);
    rchild._0_8_ = null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(&l_not_null,count,&lvdata);
    Vector::ToUnifiedFormat(&r_not_null,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 &&
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      psVar2 = pSVar14->sel_vector;
      local_420 = 0;
      for (iVar20 = 0; uVar19 = count, count != iVar20; iVar20 = iVar20 + 1) {
        sVar32 = (sel_t)iVar20;
        if (psVar2 != (sel_t *)0x0) {
          sVar32 = psVar2[iVar20];
        }
        maybe_vec.sel_vector[iVar20] = sVar32;
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&lchild,count);
      local_420 = 0;
      iVar20 = 0;
      uVar19 = 0;
      for (uVar34 = 0; count != uVar34; uVar34 = uVar34 + 1) {
        uVar42 = uVar34;
        if (pSVar14->sel_vector != (sel_t *)0x0) {
          uVar42 = (ulong)pSVar14->sel_vector[uVar34];
        }
        uVar21 = uVar34;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(lvdata.sel)->sel_vector[uVar34];
        }
        uVar38 = uVar34;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar38 = (ulong)(rvdata.sel)->sel_vector[uVar34];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar49 = false;
        }
        else {
          bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar50 = true;
        }
        else {
          bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar38 >> 6] >> (uVar38 & 0x3f) & 1) != 0;
        }
        sVar32 = (sel_t)uVar42;
        if ((bool)(bVar49 | bVar50 ^ 1U)) {
          if (rchild._0_8_ != 0) {
            this = &optional_ptr<duckdb::ValidityMask,_true>::operator->
                              ((optional_ptr<duckdb::ValidityMask,_true> *)&rchild)->
                    super_TemplatedValidityMask<unsigned_long>;
            TemplatedValidityMask<unsigned_long>::SetInvalid(this,uVar42);
          }
          if (bVar50) {
            if (true_opt.sel != (SelectionVector *)0x0) {
              (true_opt.sel)->sel_vector[local_420] = sVar32;
            }
            local_420 = local_420 + 1;
          }
          else {
            if (false_opt.sel != (SelectionVector *)0x0) {
              (false_opt.sel)->sel_vector[iVar20] = sVar32;
            }
            iVar20 = iVar20 + 1;
          }
        }
        else {
          *(int *)(lchild._0_8_ + uVar19 * 4) = (int)uVar34;
          maybe_vec.sel_vector[uVar19] = sVar32;
          uVar19 = uVar19 + 1;
        }
      }
      OptionalSelection::Advance(&true_opt,local_420);
      OptionalSelection::Advance(&false_opt,iVar20);
      if (uVar19 < count && uVar19 != 0) {
        Vector::Slice(&l_not_null,(SelectionVector *)&lchild,uVar19);
        Vector::Slice(&r_not_null,(SelectionVector *)&lchild,uVar19);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_418.ptr = null_mask.ptr;
      if (uVar19 == 0) goto LAB_01963aa1;
      SelectionVector::SelectionVector(&lcursor,uVar19);
      SelectionVector::SelectionVector(&rcursor,uVar19);
      pVVar16 = ListVector::GetEntry(&l_not_null);
      Vector::Vector((Vector *)&lvdata,pVVar16);
      pVVar16 = ListVector::GetEntry(&r_not_null);
      Vector::Vector((Vector *)&rvdata,pVVar16);
      iVar20 = ListVector::GetListSize(&l_not_null);
      Vector::Flatten((Vector *)&lvdata,iVar20);
      iVar20 = ListVector::GetListSize(&r_not_null);
      Vector::Flatten((Vector *)&rvdata,iVar20);
      Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar19);
      Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar19);
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
      Vector::ToUnifiedFormat(&l_not_null,uVar19,&lvdata_1);
      pdVar6 = lvdata_1.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
      Vector::ToUnifiedFormat(&r_not_null,uVar19,&rvdata_1);
      SelectionVector::SelectionVector(&slice_sel,uVar19);
      for (iVar20 = 0; uVar19 != iVar20; iVar20 = iVar20 + 1) {
        slice_sel.sel_vector[iVar20] = (sel_t)iVar20;
      }
      SelectionVector::SelectionVector(&true_sel_1,uVar19);
      SelectionVector::SelectionVector(&false_sel_1,uVar19);
      child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      child_validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0
      ;
      child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      child_validity.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
      if (local_418.ptr == (ValidityMask *)0x0) {
        local_3a8.ptr = (ValidityMask *)0x0;
      }
      else {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_418);
        iVar20 = ValidityMask::Capacity(pVVar15);
        local_3a8.ptr = &child_validity;
        TemplatedValidityMask<unsigned_long>::Reset
                  (&(local_3a8.ptr)->super_TemplatedValidityMask<unsigned_long>,iVar20);
      }
      pos_1 = 0;
      local_4c0 = 0;
      while (uVar19 != 0) {
        PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar19);
        PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar19);
        psVar2 = (lvdata_1.sel)->sel_vector;
        psVar4 = (rvdata_1.sel)->sel_vector;
        iVar20 = 0;
        iVar25 = 0;
        uVar34 = 0;
        for (uVar42 = 0; uVar19 != uVar42; uVar42 = uVar42 + 1) {
          uVar21 = uVar42;
          if (slice_sel.sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)slice_sel.sel_vector[uVar42];
          }
          uVar38 = uVar21;
          if (psVar2 != (sel_t *)0x0) {
            uVar38 = (ulong)psVar2[uVar21];
          }
          uVar36 = uVar21;
          if (psVar4 != (sel_t *)0x0) {
            uVar36 = (ulong)psVar4[uVar21];
          }
          if ((*(ulong *)(pdVar6 + uVar38 * 0x10 + 8) == pos_1) ||
             (*(idx_t *)(rvdata_1.data + uVar36 * 0x10 + 8) == pos_1)) {
            if (maybe_vec.sel_vector != (sel_t *)0x0) {
              uVar21 = (ulong)maybe_vec.sel_vector[uVar21];
            }
            if (*(ulong *)(rvdata_1.data + uVar36 * 0x10 + 8) <
                *(ulong *)(pdVar6 + uVar38 * 0x10 + 8)) {
              if (true_opt.sel != (SelectionVector *)0x0) {
                (true_opt.sel)->sel_vector[iVar25] = (sel_t)uVar21;
              }
              iVar25 = iVar25 + 1;
            }
            else {
              if (false_opt.sel != (SelectionVector *)0x0) {
                (false_opt.sel)->sel_vector[iVar20] = (sel_t)uVar21;
              }
              iVar20 = iVar20 + 1;
            }
          }
          else {
            true_sel_1.sel_vector[uVar34] = (sel_t)uVar21;
            uVar34 = uVar34 + 1;
          }
        }
        OptionalSelection::Advance(&true_opt,iVar25);
        OptionalSelection::Advance(&false_opt,iVar20);
        uVar42 = uVar19;
        if (uVar34 < uVar19) {
          DensifyNestedSelection(&true_sel_1,uVar34,&slice_sel);
          PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar34);
          PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar34);
          uVar42 = uVar34;
        }
        iVar20 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                           (&lchild,&rchild,&slice_sel,uVar42,&true_sel_1,&false_sel_1,local_3a8);
        ExtractNestedMask(&slice_sel,uVar42,&maybe_vec,local_3a8.ptr,local_418);
        local_4c0 = local_4c0 + iVar25;
        if (iVar20 != 0) {
          uVar42 = uVar42 - iVar20;
          pSVar14 = &true_sel_1;
          if (uVar42 == 0) {
            pSVar14 = &slice_sel;
          }
          ExtractNestedSelection(pSVar14,iVar20,&maybe_vec,&true_opt);
          local_4c0 = local_4c0 + iVar20;
          DensifyNestedSelection(&false_sel_1,uVar42,&slice_sel);
          PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar42);
          PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar42);
        }
        uVar19 = VectorOperations::NestedEquals
                           (&lchild,&rchild,&slice_sel,uVar42,&true_sel_1,&false_sel_1,local_3a8);
        ExtractNestedMask(&slice_sel,uVar42,&maybe_vec,local_3a8.ptr,local_418);
        pSVar14 = &false_sel_1;
        if (uVar19 == 0) {
          pSVar14 = &slice_sel;
        }
        ExtractNestedSelection(pSVar14,uVar42 - uVar19,&maybe_vec,&false_opt);
        if (uVar42 != uVar19) {
          DensifyNestedSelection(&true_sel_1,uVar19,&slice_sel);
        }
        pos_1 = pos_1 + 1;
      }
LAB_019671e9:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&false_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&true_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&slice_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata_1);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata_1);
      Vector::~Vector(&rchild);
      Vector::~Vector(&lchild);
      Vector::~Vector((Vector *)&rvdata);
      Vector::~Vector((Vector *)&lvdata);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      if (PVar1 == STRUCT) {
        rcursor.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar19 != 0) {
          rchild.vector_type = FLAT_VECTOR;
          rchild._1_7_ = 0;
          rchild.type.id_ = INVALID;
          rchild.type.physical_type_ = ~INVALID;
          rchild.type._2_6_ = 0;
          rchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lvdata_1.sel = (SelectionVector *)0x0;
          lvdata_1.data = (data_ptr_t)0x0;
          lvdata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          this_00 = StructVector::GetEntries(&l_not_null);
          this_01 = StructVector::GetEntries(&r_not_null);
          SelectionVector::SelectionVector((SelectionVector *)&rvdata_1,uVar19);
          for (iVar20 = 0; uVar19 != iVar20; iVar20 = iVar20 + 1) {
            *(int *)((long)&(rvdata_1.sel)->sel_vector + iVar20 * 4) = (int)iVar20;
          }
          SelectionVector::SelectionVector((SelectionVector *)&child_validity,uVar19);
          SelectionVector::SelectionVector(&lcursor,uVar19);
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lchild.vector_type = FLAT_VECTOR;
          lchild._1_7_ = 0;
          lchild.type.id_ = INVALID;
          lchild.type.physical_type_ = ~INVALID;
          lchild.type._2_6_ = 0;
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if (rcursor.sel_vector == (sel_t *)0x0) {
            null_mask_00.ptr = (ValidityMask *)0x0;
          }
          else {
            pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator->
                                ((optional_ptr<duckdb::ValidityMask,_true> *)&rcursor);
            iVar20 = ValidityMask::Capacity(pVVar15);
            null_mask_00.ptr = (ValidityMask *)&lchild;
            TemplatedValidityMask<unsigned_long>::Reset
                      ((TemplatedValidityMask<unsigned_long> *)null_mask_00.ptr,iVar20);
          }
          local_4c0 = 0;
          __n = 0;
          iVar20 = uVar19;
          while( true ) {
            if ((ulong)((long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
            pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_00,__n);
            pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            Vector::Vector((Vector *)&lvdata,pVVar18);
            Vector::Flatten((Vector *)&lvdata,uVar19);
            Vector::Slice((Vector *)&lvdata,(SelectionVector *)&rvdata_1,iVar20);
            pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_01,__n);
            pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            Vector::Vector((Vector *)&rvdata,pVVar18);
            Vector::Flatten((Vector *)&rvdata,uVar19);
            Vector::Slice((Vector *)&rvdata,(SelectionVector *)&rvdata_1,iVar20);
            iVar25 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                iVar20,(SelectionVector *)&child_validity,&lcursor,null_mask_00);
            ExtractNestedMask((SelectionVector *)&rvdata_1,iVar20,&maybe_vec,null_mask_00.ptr,
                              (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
            if (iVar25 != 0) {
              iVar20 = iVar20 - iVar25;
              pUVar33 = (UnifiedVectorFormat *)&child_validity;
              if (iVar20 == 0) {
                pUVar33 = &rvdata_1;
              }
              ExtractNestedSelection((SelectionVector *)pUVar33,iVar25,&maybe_vec,&true_opt);
              DensifyNestedSelection(&lcursor,iVar20,(SelectionVector *)&rvdata_1);
              local_4c0 = local_4c0 + iVar25;
            }
            if (__n == ((long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
              iVar25 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                 ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                  iVar20,(SelectionVector *)&child_validity,&lcursor,null_mask_00);
              ExtractNestedMask((SelectionVector *)&rvdata_1,iVar20,&maybe_vec,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar35.ptr = (SelectionVector *)&child_validity;
              if (iVar20 == iVar25) {
                oVar35.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar35.ptr,iVar25,&maybe_vec,&true_opt);
              oVar35.ptr = &lcursor;
              if (iVar25 == 0) {
                oVar35.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar35.ptr,iVar20 - iVar25,&maybe_vec,&false_opt);
              local_4c0 = local_4c0 + iVar25;
            }
            else {
              iVar25 = VectorOperations::NestedEquals
                                 ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                  iVar20,(SelectionVector *)&child_validity,&lcursor,null_mask_00);
              ExtractNestedMask((SelectionVector *)&rvdata_1,iVar20,&maybe_vec,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar35.ptr = &lcursor;
              if (iVar25 == 0) {
                oVar35.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar35.ptr,iVar20 - iVar25,&maybe_vec,&false_opt);
              if (iVar20 != iVar25) {
                DensifyNestedSelection
                          ((SelectionVector *)&child_validity,iVar25,(SelectionVector *)&rvdata_1);
                iVar20 = iVar25;
              }
            }
            Vector::~Vector((Vector *)&rvdata);
            Vector::~Vector((Vector *)&lvdata);
            __n = __n + 1;
          }
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&lcursor.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rvdata_1.validity);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&lvdata_1);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&rchild);
          goto LAB_0196728a;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&lvdata,"Unimplemented type for DISTINCT",(allocator *)&rvdata);
          NotImplementedException::NotImplementedException(this_03,(string *)&lvdata);
          __cxa_throw(this_03,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_418.ptr = null_mask.ptr;
        if (uVar19 != 0) {
          iVar20 = ArrayType::GetSize(&l_not_null.type);
          SelectionVector::SelectionVector(&lcursor,uVar19);
          SelectionVector::SelectionVector(&rcursor,uVar19);
          pVVar16 = ArrayVector::GetEntry(&l_not_null);
          Vector::Vector((Vector *)&lvdata,pVVar16);
          pVVar16 = ArrayVector::GetEntry(&r_not_null);
          Vector::Vector((Vector *)&rvdata,pVVar16);
          iVar25 = ArrayVector::GetTotalSize(&l_not_null);
          Vector::Flatten((Vector *)&lvdata,iVar25);
          iVar25 = ArrayVector::GetTotalSize(&r_not_null);
          Vector::Flatten((Vector *)&rvdata,iVar25);
          Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar19);
          Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar19);
          UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
          Vector::ToUnifiedFormat(&l_not_null,uVar19,&lvdata_1);
          UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
          Vector::ToUnifiedFormat(&r_not_null,uVar19,&rvdata_1);
          SelectionVector::SelectionVector(&slice_sel,uVar19);
          for (iVar25 = 0; uVar19 != iVar25; iVar25 = iVar25 + 1) {
            slice_sel.sel_vector[iVar25] = (sel_t)iVar25;
          }
          SelectionVector::SelectionVector(&true_sel_1,uVar19);
          SelectionVector::SelectionVector(&false_sel_1,uVar19);
          child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          child_validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          child_validity.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
          if (local_418.ptr == (ValidityMask *)0x0) {
            pos_1 = 0;
          }
          else {
            pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_418);
            iVar25 = ValidityMask::Capacity(pVVar15);
            pos_1 = (idx_t)&child_validity;
            TemplatedValidityMask<unsigned_long>::Reset
                      ((TemplatedValidityMask<unsigned_long> *)pos_1,iVar25);
          }
          local_4c0 = 0;
          iVar25 = 0;
          while (uVar19 != 0) {
            PositionArrayCursor(&lcursor,&lvdata_1,iVar25,&slice_sel,uVar19,iVar20);
            PositionArrayCursor(&rcursor,&rvdata_1,iVar25,&slice_sel,uVar19,iVar20);
            iVar39 = 0;
            uVar42 = 0;
            for (uVar34 = 0; uVar19 != uVar34; uVar34 = uVar34 + 1) {
              uVar21 = uVar34;
              if (slice_sel.sel_vector != (sel_t *)0x0) {
                uVar21 = (ulong)slice_sel.sel_vector[uVar34];
              }
              if (iVar20 == iVar25) {
                if (maybe_vec.sel_vector != (sel_t *)0x0) {
                  uVar21 = (ulong)maybe_vec.sel_vector[uVar21];
                }
                if (false_opt.sel != (SelectionVector *)0x0) {
                  (false_opt.sel)->sel_vector[iVar39] = (sel_t)uVar21;
                }
                iVar39 = iVar39 + 1;
              }
              else {
                true_sel_1.sel_vector[uVar42] = (sel_t)uVar21;
                uVar42 = uVar42 + 1;
              }
            }
            OptionalSelection::Advance(&true_opt,0);
            OptionalSelection::Advance(&false_opt,iVar39);
            uVar34 = uVar19;
            if (uVar42 < uVar19) {
              DensifyNestedSelection(&true_sel_1,uVar42,&slice_sel);
              PositionArrayCursor(&lcursor,&lvdata_1,iVar25,&slice_sel,uVar42,iVar20);
              PositionArrayCursor(&rcursor,&rvdata_1,iVar25,&slice_sel,uVar42,iVar20);
              uVar34 = uVar42;
            }
            iVar39 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               (&lchild,&rchild,&slice_sel,uVar34,&true_sel_1,&false_sel_1,
                                (optional_ptr<duckdb::ValidityMask,_true>)pos_1);
            ExtractNestedMask(&slice_sel,uVar34,&maybe_vec,(ValidityMask *)pos_1,local_418);
            if (iVar39 != 0) {
              uVar34 = uVar34 - iVar39;
              oVar35.ptr = &true_sel_1;
              if (uVar34 == 0) {
                oVar35.ptr = &slice_sel;
              }
              ExtractNestedSelection(oVar35.ptr,iVar39,&maybe_vec,&true_opt);
              local_4c0 = local_4c0 + iVar39;
              DensifyNestedSelection(&false_sel_1,uVar34,&slice_sel);
              PositionArrayCursor(&lcursor,&lvdata_1,iVar25,&slice_sel,uVar34,iVar20);
              PositionArrayCursor(&rcursor,&rvdata_1,iVar25,&slice_sel,uVar34,iVar20);
            }
            uVar19 = VectorOperations::NestedEquals
                               (&lchild,&rchild,&slice_sel,uVar34,&true_sel_1,&false_sel_1,local_418
                               );
            ExtractNestedMask(&slice_sel,uVar34,&maybe_vec,(ValidityMask *)pos_1,local_418);
            oVar35.ptr = &false_sel_1;
            if (uVar19 == 0) {
              oVar35.ptr = &slice_sel;
            }
            ExtractNestedSelection(oVar35.ptr,uVar34 - uVar19,&maybe_vec,&false_opt);
            if (uVar34 != uVar19) {
              DensifyNestedSelection(&true_sel_1,uVar19,&slice_sel);
            }
            iVar25 = iVar25 + 1;
          }
          goto LAB_019671e9;
        }
      }
LAB_01963aa1:
      local_4c0 = 0;
    }
LAB_0196728a:
    local_4c0 = local_4c0 + local_420;
    if (true_sel.ptr != (SelectionVector *)0x0) {
      pSVar14 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_1a0);
      DensifyNestedSelection(&true_vec,local_4c0,pSVar14);
    }
    if (local_240.ptr != (SelectionVector *)0x0) {
      pSVar14 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_240);
      DensifyNestedSelection(&false_vec,count - local_4c0,pSVar14);
    }
    Vector::~Vector(&r_not_null);
    Vector::~Vector(&l_not_null);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&maybe_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&true_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pUVar33 = (UnifiedVectorFormat *)&true_vec;
LAB_0196e32e:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pUVar33->validity);
    return local_4c0;
  default:
    if (PVar1 == VARCHAR) {
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar46 = (string_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar40 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar41 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              psVar46 = psVar46 + 1;
              psVar29 = psVar29 + 1;
            }
            return local_4c0;
          }
          iVar20 = 0;
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              psVar46 = psVar46 + 1;
              psVar29 = psVar29 + 1;
            }
            return local_4c0;
          }
          lVar41 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                               (psVar29,psVar46,!bVar49,!bVar50);
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            psVar46 = psVar46 + 1;
            psVar29 = psVar29 + 1;
          }
          goto LAB_0196d7a5;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar46 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          iVar20 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar41 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar25 = iVar20;
                if (*(long *)pos_1 != 0) {
                  iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
                }
                bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar50 = false;
                }
                else {
                  bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                   (psVar29,psVar46,!bVar49,bVar50);
                (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
                lVar41 = lVar41 + (ulong)!bVar49;
                psVar29 = psVar29 + 1;
              }
              goto LAB_0196e31c;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar49,bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              psVar29 = psVar29 + 1;
            }
          }
          else {
            lVar41 = 0;
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,!bVar49,bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              psVar29 = psVar29 + 1;
            }
          }
          goto LAB_0196e329;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar46 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar15 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar20 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar41 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar25 = iVar20;
                if (*(long *)pos_1 != 0) {
                  iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar49 = false;
                }
                else {
                  bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
                bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                   (psVar29,psVar46,bVar49,!bVar50);
                (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
                lVar41 = lVar41 + (ulong)!bVar49;
                psVar46 = psVar46 + 1;
              }
              goto LAB_0196e31c;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              psVar46 = psVar46 + 1;
            }
          }
          else {
            lVar41 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                                 (psVar29,psVar46,bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              psVar46 = psVar46 + 1;
            }
          }
          goto LAB_0196e329;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*puVar3 & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                             ((string_t *)left->data,(string_t *)right->data,bVar49,bVar50);
          if (!bVar49) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar20 = 0;
          for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
            iVar39 = iVar25;
            if (*(long *)pos_1 != 0) {
              iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
            }
            iVar22 = iVar25;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
            }
            iVar37 = iVar25;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar22 * 0x10),
                                (string_t *)(rvdata.data + iVar37 * 0x10),bVar49,bVar50);
            if (bVar49) {
              iVar22 = local_4c0;
              oVar23.ptr = true_sel.ptr;
              iVar37 = iVar20;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar37 = iVar20 + 1;
              iVar22 = iVar20;
              oVar23.ptr = false_sel.ptr;
            }
            (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
            iVar20 = iVar37;
          }
          goto LAB_0196c70c;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            iVar39 = iVar20;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
            }
            iVar22 = iVar20;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar39 * 0x10),
                                (string_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
            if (bVar49) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_0196c70c;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          iVar39 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar39 * 0x10),
                              (string_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
          if (!bVar49) {
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + 1;
          }
        }
        goto LAB_0196c6ff;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if (*(long *)pos_1 != 0) {
            iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
          }
          iVar22 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar37 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar49 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(lvdata.data + iVar22 * 0x10),
                              (string_t *)(rvdata.data + iVar37 * 0x10));
          if (bVar49) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
          iVar20 = iVar37;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          iVar39 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar49 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)(lvdata.data + iVar39 * 0x10),
                              (string_t *)(rvdata.data + iVar22 * 0x10));
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar49 = string_t::StringComparisonOperators::GreaterThan
                           ((string_t *)(lvdata.data + iVar39 * 0x10),
                            (string_t *)(rvdata.data + iVar22 * 0x10));
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + 1;
        }
      }
    }
    else if (PVar1 == UINT128) {
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar47 = (uhugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar40 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar41 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              puVar47 = puVar47 + 1;
              puVar30 = puVar30 + 1;
            }
            return local_4c0;
          }
          iVar20 = 0;
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              puVar47 = puVar47 + 1;
              puVar30 = puVar30 + 1;
            }
            return local_4c0;
          }
          lVar41 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                               (puVar30,puVar47,!bVar49,!bVar50);
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            puVar47 = puVar47 + 1;
            puVar30 = puVar30 + 1;
          }
          goto LAB_0196d7a5;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar47 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          iVar20 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar41 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar25 = iVar20;
                if (*(long *)pos_1 != 0) {
                  iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
                }
                bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar50 = false;
                }
                else {
                  bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                   (puVar30,puVar47,!bVar49,bVar50);
                (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
                lVar41 = lVar41 + (ulong)!bVar49;
                puVar30 = puVar30 + 1;
              }
              goto LAB_0196e31c;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar49,bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              puVar30 = puVar30 + 1;
            }
          }
          else {
            lVar41 = 0;
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,!bVar49,bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              puVar30 = puVar30 + 1;
            }
          }
          goto LAB_0196e329;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar47 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar15 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar20 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar41 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar25 = iVar20;
                if (*(long *)pos_1 != 0) {
                  iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar49 = false;
                }
                else {
                  bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
                bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                   (puVar30,puVar47,bVar49,!bVar50);
                (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
                lVar41 = lVar41 + (ulong)!bVar49;
                puVar47 = puVar47 + 1;
              }
              goto LAB_0196e31c;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              puVar47 = puVar47 + 1;
            }
          }
          else {
            lVar41 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar47,bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              puVar47 = puVar47 + 1;
            }
          }
          goto LAB_0196e329;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*puVar3 & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)left->data,(uhugeint_t *)right->data,bVar49,bVar50);
          if (!bVar49) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar20 = 0;
          for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
            iVar39 = iVar25;
            if (*(long *)pos_1 != 0) {
              iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
            }
            iVar22 = iVar25;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
            }
            iVar37 = iVar25;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar22 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar37 * 0x10),bVar49,bVar50);
            if (bVar49) {
              iVar22 = local_4c0;
              oVar23.ptr = true_sel.ptr;
              iVar37 = iVar20;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar37 = iVar20 + 1;
              iVar22 = iVar20;
              oVar23.ptr = false_sel.ptr;
            }
            (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
            iVar20 = iVar37;
          }
          goto LAB_0196c70c;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            iVar39 = iVar20;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
            }
            iVar22 = iVar20;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
            if (bVar49) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_0196c70c;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          iVar39 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
          if (!bVar49) {
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + 1;
          }
        }
        goto LAB_0196c6ff;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if (*(long *)pos_1 != 0) {
            iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
          }
          iVar22 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar37 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar49 = uhugeint_t::operator>
                             ((uhugeint_t *)(lvdata.data + iVar22 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar37 * 0x10));
          if (bVar49) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
          iVar20 = iVar37;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          iVar39 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar49 = uhugeint_t::operator>
                             ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar22 * 0x10));
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar49 = uhugeint_t::operator>
                           ((uhugeint_t *)(lvdata.data + iVar39 * 0x10),
                            (uhugeint_t *)(rvdata.data + iVar22 * 0x10));
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + 1;
        }
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_0196293a_caseD_a;
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        pos_1 = (idx_t)FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,(SelectionVector *)pos_1,count,pVVar15);
        pVVar15 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,(SelectionVector *)pos_1,count,pVVar15);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar48 = (hugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar40 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar41 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              phVar48 = phVar48 + 1;
              phVar31 = phVar31 + 1;
            }
            return local_4c0;
          }
          iVar20 = 0;
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              phVar48 = phVar48 + 1;
              phVar31 = phVar31 + 1;
            }
            return local_4c0;
          }
          lVar41 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar40->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                               (phVar31,phVar48,!bVar49,!bVar50);
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + (ulong)!bVar49;
            phVar48 = phVar48 + 1;
            phVar31 = phVar31 + 1;
          }
          goto LAB_0196d7a5;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar48 = (hugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar15 = &left->validity;
          iVar20 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar41 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar25 = iVar20;
                if (*(long *)pos_1 != 0) {
                  iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
                }
                bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar50 = false;
                }
                else {
                  bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                   (phVar31,phVar48,!bVar49,bVar50);
                (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
                lVar41 = lVar41 + (ulong)!bVar49;
                phVar31 = phVar31 + 1;
              }
              goto LAB_0196e31c;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar49,bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              phVar31 = phVar31 + 1;
            }
          }
          else {
            lVar41 = 0;
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              bVar49 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar50 = false;
              }
              else {
                bVar50 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,!bVar49,bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              phVar31 = phVar31 + 1;
            }
          }
          goto LAB_0196e329;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar48 = (hugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar15 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar20 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar41 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar25 = iVar20;
                if (*(long *)pos_1 != 0) {
                  iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar49 = false;
                }
                else {
                  bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
                bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                   (phVar31,phVar48,bVar49,!bVar50);
                (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
                lVar41 = lVar41 + (ulong)!bVar49;
                phVar48 = phVar48 + 1;
              }
              goto LAB_0196e31c;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              phVar48 = phVar48 + 1;
            }
          }
          else {
            lVar41 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar49 = false;
              }
              else {
                bVar49 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar50 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar15->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar48,bVar49,!bVar50);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + bVar49;
              (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
              lVar41 = lVar41 + (ulong)!bVar49;
              phVar48 = phVar48 + 1;
            }
          }
          goto LAB_0196e329;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*puVar3 & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)left->data,(hugeint_t *)right->data,bVar49,bVar50);
          if (!bVar49) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar25 = iVar20;
              if (*(long *)pos_1 != 0) {
                iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar25;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar20 = 0;
          for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
            iVar39 = iVar25;
            if (*(long *)pos_1 != 0) {
              iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
            }
            iVar22 = iVar25;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
            }
            iVar37 = iVar25;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                               ((hugeint_t *)(lvdata.data + iVar22 * 0x10),
                                (hugeint_t *)(rvdata.data + iVar37 * 0x10),bVar49,bVar50);
            if (bVar49) {
              iVar22 = local_4c0;
              oVar23.ptr = true_sel.ptr;
              iVar37 = iVar20;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar37 = iVar20 + 1;
              iVar22 = iVar20;
              oVar23.ptr = false_sel.ptr;
            }
            (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
            iVar20 = iVar37;
          }
          goto LAB_0196c70c;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar25 = iVar20;
            if (*(long *)pos_1 != 0) {
              iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
            }
            iVar39 = iVar20;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
            }
            iVar22 = iVar20;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar49 = false;
            }
            else {
              bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar50 = false;
            }
            else {
              bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
            }
            bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                               ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                                (hugeint_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
            if (bVar49) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_0196c70c;
        }
        lVar41 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          iVar39 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar49 = false;
          }
          else {
            bVar49 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar39 >> 6] >> (iVar39 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar50 = false;
          }
          else {
            bVar50 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          bVar49 = DistinctGreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar22 * 0x10),bVar49,bVar50);
          if (!bVar49) {
            (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
            lVar41 = lVar41 + 1;
          }
        }
        goto LAB_0196c6ff;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar25 = 0; count != iVar25; iVar25 = iVar25 + 1) {
          iVar39 = iVar25;
          if (*(long *)pos_1 != 0) {
            iVar39 = (idx_t)*(uint *)(*(long *)pos_1 + iVar25 * 4);
          }
          iVar22 = iVar25;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar25];
          }
          iVar37 = iVar25;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar25];
          }
          bVar49 = GreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar22 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar37 * 0x10));
          if (bVar49) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar39;
          iVar20 = iVar37;
        }
        goto LAB_0196c70c;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar25 = iVar20;
          if (*(long *)pos_1 != 0) {
            iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
          }
          iVar39 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar49 = GreaterThan::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar22 * 0x10));
          if (bVar49) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0196c70c;
      }
      lVar41 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar25 = iVar20;
        if (*(long *)pos_1 != 0) {
          iVar25 = (idx_t)*(uint *)(*(long *)pos_1 + iVar20 * 4);
        }
        iVar39 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar39 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar49 = GreaterThan::Operation<duckdb::hugeint_t>
                           ((hugeint_t *)(lvdata.data + iVar39 * 0x10),
                            (hugeint_t *)(rvdata.data + iVar22 * 0x10));
        if (!bVar49) {
          (false_sel.ptr)->sel_vector[lVar41] = (sel_t)iVar25;
          lVar41 = lVar41 + 1;
        }
      }
    }
LAB_0196c635:
    local_4c0 = count - lVar41;
    goto LAB_0196c70c;
  }
  local_4c0 = count - lVar41;
LAB_0196c70c:
  UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
  return local_4c0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}